

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O3

panel * get_panel_combat(void)

{
  int iVar1;
  object *obj;
  wchar_t wVar2;
  wchar_t wVar3;
  panel *p;
  panel_line *ppVar4;
  object *poVar5;
  wchar_t wVar6;
  ulong uVar7;
  uint local_38;
  
  p = (panel *)mem_zalloc(0x18);
  p->len = 0;
  p->max = 9;
  ppVar4 = (panel_line *)mem_zalloc(0x168);
  p->lines = ppVar4;
  panel_line(p,'\x0e',"Armor","[%d,%+d]",(ulong)(uint)(player->known_state).ac,
             (ulong)(uint)(player->known_state).to_a);
  poVar5 = equipped_item_by_slot_name(player,"weapon");
  iVar1 = (player->state).skills[6];
  wVar3 = (player->known_state).to_h;
  wVar6 = (player->known_state).to_d;
  if ((poVar5 == (object *)0x0) || (obj = poVar5->known, obj == (object *)0x0)) {
    local_38 = 1;
    uVar7 = 1;
  }
  else {
    uVar7 = (ulong)obj->dd;
    local_38 = (uint)obj->ds;
    wVar2 = object_to_dam(obj);
    wVar6 = wVar6 + wVar2;
    wVar2 = object_to_hit(poVar5->known);
    wVar3 = wVar2 + wVar3;
  }
  wVar2 = wVar3 + L'\x02';
  if ((player->known_state).bless_wield == false) {
    wVar2 = wVar3;
  }
  panel_space(p);
  panel_line(p,'\x0e',"Melee","%dd%d,%+d",uVar7,(ulong)local_38,wVar6);
  panel_line(p,'\x0e',"To-hit","%d,%+d",(ulong)(uint)(iVar1 / 3),(ulong)(uint)wVar2);
  wVar3 = (player->state).num_blows;
  panel_line(p,'\x0e',"Blows","%d.%d/turn",(ulong)(uint)(wVar3 / 100),
             (ulong)(uint)((wVar3 / 10) % 10));
  poVar5 = equipped_item_by_slot_name(player,"shooting");
  iVar1 = (player->state).skills[7];
  wVar3 = (player->known_state).to_h;
  if (poVar5 == (object *)0x0) {
    wVar6 = L'\0';
  }
  else {
    wVar6 = L'\0';
    if (poVar5->known != (object *)0x0) {
      wVar6 = object_to_dam(poVar5->known);
      wVar2 = object_to_hit(poVar5->known);
      wVar3 = wVar3 + wVar2;
    }
  }
  panel_space(p);
  panel_line(p,'\x0e',"Shoot to-dam","%+d",(ulong)(uint)wVar6);
  panel_line(p,'\x0e',"To-hit","%d,%+d",(ulong)(uint)(iVar1 / 3),(ulong)(uint)wVar3);
  wVar3 = (player->state).num_shots;
  panel_line(p,'\x0e',"Shots","%d.%d/turn",(ulong)(uint)(wVar3 / 10),(ulong)(uint)(wVar3 % 10));
  return p;
}

Assistant:

static struct panel *get_panel_combat(void) {
	struct panel *p = panel_allocate(9);
	struct object *obj;
	int bth, dam, hit;
	int melee_dice = 1, melee_sides = 1;

	/* AC */
	panel_line(p, COLOUR_L_BLUE, "Armor", "[%d,%+d]",
			player->known_state.ac, player->known_state.to_a);

	/* Melee */
	obj = equipped_item_by_slot_name(player, "weapon");
	bth = (player->state.skills[SKILL_TO_HIT_MELEE] * 10) / BTH_PLUS_ADJ;
	dam = player->known_state.to_d;
	hit = player->known_state.to_h;
	if (obj && obj->known) {
		melee_dice = obj->known->dd;
		melee_sides = obj->known->ds;
		dam += object_to_dam(obj->known);
		hit += object_to_hit(obj->known);
	}
	if (player->known_state.bless_wield) {
		hit += 2;
	}

	panel_space(p);
	panel_line(p, COLOUR_L_BLUE, "Melee", "%dd%d,%+d", melee_dice, melee_sides, dam);
	panel_line(p, COLOUR_L_BLUE, "To-hit", "%d,%+d", bth / 10, hit);
	panel_line(p, COLOUR_L_BLUE, "Blows", "%d.%d/turn",
			player->state.num_blows / 100, (player->state.num_blows / 10 % 10));

	/* Ranged */
	obj = equipped_item_by_slot_name(player, "shooting");
	bth = (player->state.skills[SKILL_TO_HIT_BOW] * 10) / BTH_PLUS_ADJ;
	dam = 0;
	hit = player->known_state.to_h;
	if (obj && obj->known) {
		dam += object_to_dam(obj->known);
		hit += object_to_hit(obj->known);
	}

	panel_space(p);
	panel_line(p, COLOUR_L_BLUE, "Shoot to-dam", "%+d", dam);
	panel_line(p, COLOUR_L_BLUE, "To-hit", "%d,%+d", bth / 10, hit);
	panel_line(p, COLOUR_L_BLUE, "Shots", "%d.%d/turn",
			   player->state.num_shots / 10, player->state.num_shots % 10);

	return p;
}